

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O0

void TestWaveform(AmpIO *board)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  void *pvVar4;
  double extraout_XMM0_Qa;
  byte local_830;
  byte local_82f;
  byte local_82e;
  byte local_82d;
  uchar dout4;
  uchar dout3;
  uchar dout2;
  uchar dout1;
  uint32_t numTicks;
  double clkPer;
  size_t i;
  quadlet_t waveform_read [256];
  quadlet_t waveform [256];
  uint WLEN;
  AmpIO *board_local;
  
  (*(board->super_FpgaIO).super_BoardIO._vptr_BoardIO[10])();
  uVar2 = (uint)(long)(0.001 / extraout_XMM0_Qa);
  poVar3 = std::operator<<((ostream *)&std::cout,"Setting waveform with ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar2);
  poVar3 = std::operator<<(poVar3," counts (1 msec edges)");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  if ((uVar2 & 0x7fffff) != uVar2) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Warning: numTicks does not fit in 23 bits");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  local_82d = 0;
  local_82e = 0;
  local_82f = 0;
  local_830 = 0;
  for (clkPer = 0.0; (ulong)clkPer < 0xff; clkPer = (double)((long)clkPer + 1)) {
    if (((ulong)clkPer & 3) == 0) {
      local_82d = 1 - local_82d;
    }
    if (((ulong)clkPer & 3) == 1) {
      local_82e = 1 - local_82e;
    }
    if (((ulong)clkPer & 3) == 2) {
      local_82f = 1 - local_82f;
    }
    if (((ulong)clkPer & 3) == 3) {
      local_830 = 1 - local_830;
    }
    waveform_read[(long)clkPer + 0xfe] =
         uVar2 << 8 | 0x80000000 | (uint)local_830 << 3 | (uint)local_82f << 2 |
         (uint)local_82e << 1 | (uint)local_82d;
    waveform_read[(long)clkPer + -2] = 0;
  }
  waveform_read[0xfd] = 0;
  poVar3 = std::operator<<((ostream *)&std::cout,"Writing test pattern");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  bVar1 = AmpIO::WriteWaveformTable(board,waveform_read + 0xfe,0,0x100);
  if (bVar1) {
    Amp1394_Sleep(0.05);
    poVar3 = std::operator<<((ostream *)&std::cout,"Reading data");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    bVar1 = AmpIO::ReadWaveformTable(board,(quadlet_t *)&i,0,0x100);
    if (bVar1) {
      for (clkPer = 0.0; (ulong)clkPer < 0x100; clkPer = (double)((long)clkPer + 1)) {
        if (waveform_read[(long)clkPer + -2] != waveform_read[(long)clkPer + 0xfe]) {
          poVar3 = std::operator<<((ostream *)&std::cout,"Mismatch at quadlet ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ulong)clkPer);
          poVar3 = std::operator<<(poVar3,", read ");
          pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
          poVar3 = (ostream *)std::ostream::operator<<(pvVar4,waveform_read[(long)clkPer + -2]);
          poVar3 = std::operator<<(poVar3,", expected ");
          pvVar4 = (void *)std::ostream::operator<<(poVar3,waveform_read[(long)clkPer + 0xfe]);
          pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::dec);
          std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
          return;
        }
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"Pattern verified!");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"ReadWaveformTable failed");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"WriteWaveformTable failed");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void TestWaveform(AmpIO *board)
{
    const unsigned int WLEN = 256;
    quadlet_t waveform[WLEN];
    quadlet_t waveform_read[WLEN];
    size_t i;
    // Set up square waves that change every 1 msec
    double clkPer = board->GetFPGAClockPeriod();
    uint32_t numTicks = static_cast<uint32_t>(0.001/clkPer);
    std::cout << "Setting waveform with " << numTicks << " counts (1 msec edges)" << std::endl;
    if ((numTicks&0x7fffff) != numTicks)
        std::cout << "Warning: numTicks does not fit in 23 bits" << std::endl;
    unsigned char dout1 = 0;
    unsigned char dout2 = 0;
    unsigned char dout3 = 0;
    unsigned char dout4 = 0;
    for (i = 0; i < WLEN-1; i++) {
        if (i%4 == 0) dout1 = 1-dout1;
        if (i%4 == 1) dout2 = 1-dout2;
        if (i%4 == 2) dout3 = 1-dout3;
        if (i%4 == 3) dout4 = 1-dout4;
        waveform[i] = 0x80000000 | (numTicks << 8) | (dout4 << 3) | (dout3 << 2) | (dout2 << 1) | dout1;
        waveform_read[i] = 0;
    }
    waveform[WLEN-1] = 0;
    waveform_read[WLEN-1] = 0;
    std::cout << "Writing test pattern" << std::endl;
    if (!board->WriteWaveformTable(waveform, 0, WLEN)) {
        std::cout << "WriteWaveformTable failed" << std::endl;
        return;
    }
    Amp1394_Sleep(0.05);
    std::cout << "Reading data" << std::endl;
    if (!board->ReadWaveformTable(waveform_read, 0, WLEN)) {
        std::cout << "ReadWaveformTable failed" << std::endl;
        return;
    }
    for (i = 0; i < WLEN; i++) {
        if (waveform_read[i] != waveform[i]) {
            std::cout << "Mismatch at quadlet " << i << ", read " << std::hex
                      << waveform_read[i] << ", expected " << waveform[i]
                      << std::dec << std::endl;
            return;
        }
    }
    std::cout << "Pattern verified!" << std::endl;
#if 0
    // Following code will actually generate waveform on DOUT lines
    board->WriteDigitalOutput(0x0f,0x00);
    // Start waveform on all DOUT channels
    board->WriteWaveformControl(0x0f, 0x0f);
#endif
}